

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_SetElementI<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  bool bVar2;
  long *aValue;
  Var varIndex;
  Var value;
  JavascriptArray *array;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  aValue = (long *)GetReg<unsigned_char>
                             (this,(playout->
                                   super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                   ).Instance);
  varIndex = GetReg<unsigned_char>
                       (this,(playout->
                             super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                             Element);
  value = GetReg<unsigned_char>
                    (this,(playout->
                          super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Value)
  ;
  bVar2 = TaggedNumber::Is(aValue);
  if ((!bVar2) && (*aValue == VirtualTableInfo<Js::JavascriptArray>::Address)) {
    bVar2 = JavascriptOperators::SetElementMayHaveImplicitCalls(*(ScriptContext **)(this + 0x78));
    if (!bVar2) {
      array = UnsafeVarTo<Js::JavascriptArray>(aValue);
      ProfilingHelpers::ProfiledStElem_FastPath
                (array,varIndex,value,*(ScriptContext **)(this + 0x78),flags,(StElemInfo *)0x0);
      goto LAB_00966043;
    }
  }
  JavascriptOperators::OP_SetElementI(aValue,varIndex,value,*(ScriptContext **)(this + 0x78),flags);
LAB_00966043:
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xef);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetElementI(const unaligned T* playout, PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Same fast path as in the backend.

        Var instance = GetReg(playout->Instance);
        const Var varIndex = GetReg(playout->Element);
        const Var value = GetReg(playout->Value);

#if ENABLE_PROFILE_INFO
        // Only enable fast path if the javascript array is not cross site
        if (!TaggedNumber::Is(instance) &&
            VirtualTableInfo<JavascriptArray>::HasVirtualTable(instance) &&
            !JavascriptOperators::SetElementMayHaveImplicitCalls(GetScriptContext()))
        {
            ProfilingHelpers::ProfiledStElem_FastPath(
                UnsafeVarTo<JavascriptArray>(instance),
                varIndex,
                value,
                GetScriptContext(),
                flags);
        }
        else
#endif
        {
            JavascriptOperators::OP_SetElementI(instance, varIndex, value, GetScriptContext(), flags);
        }

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }